

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * __thiscall
Lowerer::GenerateIndirOfOOPData(Lowerer *this,void *address,int32 offset,Instr *instrInsert)

{
  uint left;
  Func *this_00;
  StackSym *sym;
  RegOpnd *baseOpnd;
  char16 *desc;
  IndirOpnd *pIVar1;
  Opnd *opnd;
  Func *pFStack_30;
  int32 dataOffset;
  Func *func;
  Instr *instrInsert_local;
  void *pvStack_18;
  int32 offset_local;
  void *address_local;
  Lowerer *this_local;
  
  pFStack_30 = instrInsert->m_func;
  func = (Func *)instrInsert;
  instrInsert_local._4_4_ = offset;
  pvStack_18 = address;
  address_local = this;
  left = NativeCodeData::GetDataTotalOffset(address);
  Int32Math::Add(left,instrInsert_local._4_4_,(int32 *)((long)&opnd + 4));
  this_00 = Func::GetTopFunc(pFStack_30);
  sym = Func::GetNativeCodeDataSym(this_00);
  baseOpnd = IR::RegOpnd::New(sym,TyVar,this->m_func);
  desc = NativeCodeData::GetDataDescription(pvStack_18,pFStack_30->m_alloc);
  pIVar1 = IR::IndirOpnd::New(baseOpnd,opnd._4_4_,TyUint64,desc,pFStack_30,true);
  return &pIVar1->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::GenerateIndirOfOOPData(void * address, int32 offset, IR::Instr * instrInsert)
{
    Func * func = instrInsert->m_func;
    int32 dataOffset;
    Int32Math::Add(NativeCodeData::GetDataTotalOffset(address), offset, &dataOffset);
    IR::Opnd * opnd = IR::IndirOpnd::New(IR::RegOpnd::New(func->GetTopFunc()->GetNativeCodeDataSym(), TyVar, m_func), dataOffset, TyMachPtr,
#if DBG
                                         NativeCodeData::GetDataDescription(address, func->m_alloc),
#endif
                                         func, true);

    return opnd;
}